

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGeneric.cpp
# Opt level: O3

void __thiscall chrono::ChConstraintTwoGeneric::Update_auxiliary(ChConstraintTwoGeneric *this)

{
  double dVar1;
  ChVariables *pCVar2;
  long lVar3;
  int iVar4;
  char *__function;
  scalar_sum_op<double,_double> local_89;
  double *local_88;
  Scalar local_80;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_78;
  long local_60;
  undefined8 uStack_58;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_50;
  double *local_38;
  long local_30;
  double *local_20;
  long local_18;
  
  pCVar2 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar2->disabled == false) {
    iVar4 = (*pCVar2->_vptr_ChVariables[2])();
    if (iVar4 < 1) goto LAB_007d5962;
    local_20 = (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data;
    local_18 = (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_rows;
    pCVar2 = (this->super_ChConstraintTwo).variables_a;
    if (-1 < local_18 || local_20 == (double *)0x0) {
      local_60 = 0;
      uStack_58 = 0;
      local_78.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d._0_8_ = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_data;
      local_78.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
      .
      super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data =
           (evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>)
           (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
           m_cols;
      if (-1 < (long)local_78.
                     super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     .
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_d.lhsImpl.
                     super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                     .
                     super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
                     .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                     .m_d.data ||
          (double *)
          local_78.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d._0_8_ == (double *)0x0) {
        (*pCVar2->_vptr_ChVariables[4])(pCVar2,&local_20,&local_78);
        if (local_60 != 0) {
          free(*(void **)(local_60 + -8));
        }
        goto LAB_007d5962;
      }
LAB_007d5b67:
      uStack_58 = 0;
      local_60 = 0;
      __function = 
      "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
      ;
      goto LAB_007d5b7c;
    }
LAB_007d5b50:
    __function = 
    "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
LAB_007d5b7c:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
  }
LAB_007d5962:
  pCVar2 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar2->disabled == false) {
    iVar4 = (*pCVar2->_vptr_ChVariables[2])();
    if (0 < iVar4) {
      local_38 = (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
      local_30 = (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
      pCVar2 = (this->super_ChConstraintTwo).variables_b;
      if (local_30 < 0 && local_38 != (double *)0x0) goto LAB_007d5b50;
      local_60 = 0;
      uStack_58 = 0;
      local_78.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d._0_8_ = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                   m_storage.m_data;
      local_78.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
      .
      super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data =
           (evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>)
           (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
           m_cols;
      if ((long)local_78.
                super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                .
                super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                .m_d.lhsImpl.
                super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.
                super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
                .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.
                m_d.data < 0 &&
          (double *)
          local_78.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d._0_8_ != (double *)0x0) goto LAB_007d5b67;
      (*pCVar2->_vptr_ChVariables[4])(pCVar2,&local_38,&local_78);
      if (local_60 != 0) {
        free(*(void **)(local_60 + -8));
      }
    }
  }
  (this->super_ChConstraintTwo).super_ChConstraint.g_i = 0.0;
  pCVar2 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar2->disabled == false) {
    iVar4 = (*pCVar2->_vptr_ChVariables[2])();
    if (0 < iVar4) {
      lVar3 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols;
      if (lVar3 != (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows) goto LAB_007d5b86;
      local_88 = &local_80;
      local_50.m_lhs.m_matrix = &this->Cq_a;
      local_50.m_rhs = &this->Eq_a;
      if (lVar3 == 0) {
        local_80 = 0.0;
      }
      else {
        if (lVar3 < 1) goto LAB_007d5ba5;
        local_78.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.
        super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
        .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data =
             (evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>)
             (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
        local_78.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
        local_80 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                             (&local_78,&local_89,&local_50);
      }
      (this->super_ChConstraintTwo).super_ChConstraint.g_i =
           *local_88 + (this->super_ChConstraintTwo).super_ChConstraint.g_i;
    }
  }
  pCVar2 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar2->disabled == false) {
    iVar4 = (*pCVar2->_vptr_ChVariables[2])();
    if (0 < iVar4) {
      lVar3 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols;
      if (lVar3 != (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows) {
LAB_007d5b86:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, 1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_88 = &local_80;
      local_50.m_lhs.m_matrix = &this->Cq_b;
      local_50.m_rhs = &this->Eq_b;
      if (lVar3 == 0) {
        local_80 = 0.0;
      }
      else {
        if (lVar3 < 1) {
LAB_007d5ba5:
          local_88 = &local_80;
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, 1, -1>>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, 1, -1>>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        local_78.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.
        super_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.
        super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_Eigen::internal::IndexBased,_double>
        .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>.m_d.data =
             (evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>)
             (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
        local_78.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             (this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
        local_80 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,-1,1,1,-1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                             (&local_78,&local_89,&local_50);
      }
      (this->super_ChConstraintTwo).super_ChConstraint.g_i =
           *local_88 + (this->super_ChConstraintTwo).super_ChConstraint.g_i;
    }
  }
  dVar1 = (this->super_ChConstraintTwo).super_ChConstraint.cfm_i;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    (this->super_ChConstraintTwo).super_ChConstraint.g_i =
         dVar1 + (this->super_ChConstraintTwo).super_ChConstraint.g_i;
  }
  return;
}

Assistant:

void ChConstraintTwoGeneric::Update_auxiliary() {
    // 1- Assuming jacobians are already computed, now compute
    //   the matrices [Eq_a]=[invM_a]*[Cq_a]' and [Eq_b]
    if (variables_a->IsActive() && variables_a->Get_ndof() > 0) {
        variables_a->Compute_invMb_v(Eq_a, Cq_a.transpose());
    }
    if (variables_b->IsActive() && variables_b->Get_ndof() > 0) {
        variables_b->Compute_invMb_v(Eq_b, Cq_b.transpose());
    }

    // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
    g_i = 0;
    if (variables_a->IsActive() && variables_a->Get_ndof() > 0) {
        g_i += Cq_a * Eq_a;
    }
    if (variables_b->IsActive() && variables_b->Get_ndof() > 0) {
        g_i += Cq_b * Eq_b;
    }

    // 3- adds the constraint force mixing term (usually zero):
    if (cfm_i != 0)
        g_i += cfm_i;
}